

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

String * __thiscall
kj::encodeCEscape(String *__return_storage_ptr__,kj *this,ArrayPtr<const_unsigned_char> bytes)

{
  String *pSVar1;
  uchar *count;
  uchar *puVar2;
  byte b;
  Vector<char> escaped;
  kj local_81;
  StringPtr local_80;
  String *local_70;
  ArrayBuilder<char> local_68;
  Array<char> local_48;
  
  count = bytes.ptr;
  local_70 = __return_storage_ptr__;
  local_68.ptr = _::HeapArrayDisposer::allocateUninitialized<char>((size_t)count);
  local_68.endPtr = local_68.ptr + (long)count;
  local_68.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_68.pos = local_68.ptr;
  for (puVar2 = (uchar *)0x0; count != puVar2; puVar2 = puVar2 + 1) {
    local_81 = this[(long)puVar2];
    switch(local_81) {
    case (kj)0x7:
      local_80.content.ptr = "\\a";
      local_80.content.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      break;
    case (kj)0x8:
      local_80.content.ptr = "\\b";
      local_80.content.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      break;
    case (kj)0x9:
      local_80.content.ptr = "\\t";
      local_80.content.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      break;
    case (kj)0xa:
      local_80.content.ptr = "\\n";
      local_80.content.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      break;
    case (kj)0xb:
      local_80.content.ptr = "\\v";
      local_80.content.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      break;
    case (kj)0xc:
      local_80.content.ptr = "\\f";
      local_80.content.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      break;
    case (kj)0xd:
      local_80.content.ptr = "\\r";
      local_80.content.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      break;
    default:
      if (local_81 == (kj)0x22) {
        local_80.content.ptr = "\\\"";
        local_80.content.size_ = 3;
        Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      }
      else if (local_81 == (kj)0x27) {
        local_80.content.ptr = "\\\'";
        local_80.content.size_ = 3;
        Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      }
      else if (local_81 == (kj)0x5c) {
        local_80.content.ptr = "\\\\";
        local_80.content.size_ = 3;
        Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      }
      else if ((byte)local_81 < 0x20 || local_81 == (kj)0x7f) {
        local_80.content.ptr = (char *)CONCAT71(local_80.content.ptr._1_7_,0x5c);
        Vector<char>::add<char>((Vector<char> *)&local_68,(char *)&local_80);
        Vector<char>::add<char_const&>
                  ((Vector<char> *)&local_68,"0123456789abcdef" + ((byte)local_81 >> 6));
        Vector<char>::add<char_const&>
                  ((Vector<char> *)&local_68,"0123456789abcdef" + ((byte)local_81 >> 3 & 7));
        Vector<char>::add<char_const&>
                  ((Vector<char> *)&local_68,"0123456789abcdef" + ((byte)local_81 & 7));
      }
      else {
        Vector<char>::add<unsigned_char&>((Vector<char> *)&local_68,(uchar *)&local_81);
      }
    }
  }
  local_80.content.ptr = (char *)((ulong)local_80.content.ptr & 0xffffffff00000000);
  Vector<char>::add<int>((Vector<char> *)&local_68,(int *)&local_80);
  Vector<char>::releaseAsArray(&local_48,(Vector<char> *)&local_68);
  pSVar1 = local_70;
  (local_70->content).ptr = local_48.ptr;
  (local_70->content).size_ = local_48.size_;
  (local_70->content).disposer = local_48.disposer;
  local_48.ptr = (char *)0x0;
  local_48.size_ = 0;
  Array<char>::~Array(&local_48);
  ArrayBuilder<char>::dispose(&local_68);
  return pSVar1;
}

Assistant:

String encodeCEscape(ArrayPtr<const byte> bytes) {
  Vector<char> escaped(bytes.size());

  for (byte b: bytes) {
    switch (b) {
      case '\a': escaped.addAll(StringPtr("\\a")); break;
      case '\b': escaped.addAll(StringPtr("\\b")); break;
      case '\f': escaped.addAll(StringPtr("\\f")); break;
      case '\n': escaped.addAll(StringPtr("\\n")); break;
      case '\r': escaped.addAll(StringPtr("\\r")); break;
      case '\t': escaped.addAll(StringPtr("\\t")); break;
      case '\v': escaped.addAll(StringPtr("\\v")); break;
      case '\'': escaped.addAll(StringPtr("\\\'")); break;
      case '\"': escaped.addAll(StringPtr("\\\"")); break;
      case '\\': escaped.addAll(StringPtr("\\\\")); break;
      default:
        if (b < 0x20 || b == 0x7f) {
          // Use octal escape, not hex, because hex escapes technically have no length limit and
          // so can create ambiguity with subsequent characters.
          escaped.add('\\');
          escaped.add(HEX_DIGITS[b / 64]);
          escaped.add(HEX_DIGITS[(b / 8) % 8]);
          escaped.add(HEX_DIGITS[b % 8]);
        } else {
          escaped.add(b);
        }
        break;
    }
  }

  escaped.add(0);
  return String(escaped.releaseAsArray());
}